

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

int Fra_ClassesRefine(Fra_Cla_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  long *Entry;
  int local_28;
  int local_24;
  int nRefis;
  int i;
  Aig_Obj_t **pClass;
  Vec_Ptr_t *vTemp;
  Fra_Cla_t *p_local;
  
  local_28 = 0;
  Vec_PtrClear(p->vClassesTemp);
  local_24 = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(p->vClasses);
    if (iVar2 <= local_24) {
      pVVar1 = p->vClassesTemp;
      p->vClassesTemp = p->vClasses;
      p->vClasses = pVVar1;
      return local_28;
    }
    Entry = (long *)Vec_PtrEntry(p->vClasses,local_24);
    if (*Entry == 0) break;
    Vec_PtrPush(p->vClassesTemp,Entry);
    iVar2 = Fra_RefineClassLastIter(p,p->vClassesTemp);
    local_28 = iVar2 + local_28;
    local_24 = local_24 + 1;
  }
  __assert_fail("pClass[0] != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                ,0x1f8,"int Fra_ClassesRefine(Fra_Cla_t *)");
}

Assistant:

int Fra_ClassesRefine( Fra_Cla_t * p )
{
    Vec_Ptr_t * vTemp;
    Aig_Obj_t ** pClass;
    int i, nRefis;
    // refine the classes
    nRefis = 0;
    Vec_PtrClear( p->vClassesTemp );
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // add the class to the new array
        assert( pClass[0] != NULL );
        Vec_PtrPush( p->vClassesTemp, pClass );
        // refine the class iteratively
        nRefis += Fra_RefineClassLastIter( p, p->vClassesTemp );
    }
    // exchange the class representation
    vTemp = p->vClassesTemp;
    p->vClassesTemp = p->vClasses;
    p->vClasses = vTemp;
    return nRefis;
}